

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManFindFirstCommonLit(Vec_Int_t *vArr1,Vec_Int_t *vArr2,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *local_58;
  int *local_48;
  
  piVar9 = vArr1->pArray;
  local_48 = vArr2->pArray;
  piVar1 = piVar9 + vArr1->nSize;
  piVar2 = local_48 + vArr2->nSize;
  piVar10 = piVar9;
  piVar11 = piVar9;
  local_58 = local_48;
  piVar8 = local_48;
  while ((piVar10 < piVar1 && (piVar8 < piVar2))) {
    iVar5 = Abc_Lit2Var(*piVar10);
    iVar6 = Abc_Lit2Var(*piVar8);
    iVar3 = *piVar10;
    iVar4 = *piVar8;
    if (iVar5 == iVar6) {
      if (iVar3 != iVar4) {
        return iVar3;
      }
      piVar10 = piVar10 + 1;
      piVar8 = piVar8 + 1;
      piVar11 = piVar9;
    }
    else if (iVar3 < iVar4) {
      *piVar9 = iVar3;
      piVar9 = piVar9 + 1;
      piVar10 = piVar10 + 1;
      piVar11 = piVar11 + 1;
    }
    else {
      piVar8 = piVar8 + 1;
      *local_58 = iVar4;
      local_58 = local_58 + 1;
      local_48 = local_48 + 1;
      piVar11 = piVar9;
    }
  }
  for (lVar7 = 0; (int *)((long)piVar10 + lVar7) < piVar1; lVar7 = lVar7 + 4) {
    *(int *)((long)piVar9 + lVar7) = *(int *)((long)piVar10 + lVar7);
    piVar11 = piVar11 + 1;
  }
  for (lVar7 = 0; (int *)((long)piVar8 + lVar7) < piVar2; lVar7 = lVar7 + 4) {
    *(int *)((long)local_58 + lVar7) = *(int *)((long)piVar8 + lVar7);
    local_48 = local_48 + 1;
  }
  Vec_IntShrink(vArr1,(int)((ulong)((long)piVar11 - (long)vArr1->pArray) >> 2));
  Vec_IntShrink(vArr2,(int)((ulong)((long)local_48 - (long)vArr2->pArray) >> 2));
  return -1;
}

Assistant:

static inline int Gia_ManFindFirstCommonLit( Vec_Int_t * vArr1, Vec_Int_t * vArr2, int fVerbose )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int * pStart1 = vArr1->pArray;
    int * pStart2 = vArr2->pArray;
    int nRemoved = 0;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( Abc_Lit2Var(*pBeg1) == Abc_Lit2Var(*pBeg2) )
        { 
            if ( *pBeg1 != *pBeg2 ) 
                return *pBeg1; 
            else
                pBeg1++, pBeg2++;
            nRemoved++;
        }
        else if ( *pBeg1 < *pBeg2 )
            *pStart1++ = *pBeg1++;
        else 
            *pStart2++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pStart1++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pStart2++ = *pBeg2++;
    Vec_IntShrink( vArr1, pStart1 - vArr1->pArray );
    Vec_IntShrink( vArr2, pStart2 - vArr2->pArray );
    //if ( fVerbose ) printf( "Removed %d duplicated entries.  Array1 = %d.  Array2 = %d.\n", nRemoved, Vec_IntSize(vArr1), Vec_IntSize(vArr2) );
    return -1;
}